

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

void __thiscall slang::SVInt::initSlowCase(SVInt *this,uint64_t value)

{
  uint32_t uVar1;
  size_t __n;
  void *__s;
  long in_RSI;
  long *in_RDI;
  uint32_t i;
  uint32_t words;
  uint local_18;
  
  uVar1 = getNumWords((SVInt *)0x50cd4d);
  __n = SUB168(ZEXT416(uVar1) * ZEXT816(8),0);
  if (SUB168(ZEXT416(uVar1) * ZEXT816(8),8) != 0) {
    __n = 0xffffffffffffffff;
  }
  __s = operator_new__(0x50cd7b);
  memset(__s,0,__n);
  *in_RDI = (long)__s;
  *(long *)*in_RDI = in_RSI;
  if (((*(byte *)((long)in_RDI + 0xc) & 1) != 0) && (in_RSI < 0)) {
    for (local_18 = 1; local_18 < uVar1; local_18 = local_18 + 1) {
      *(undefined8 *)(*in_RDI + (ulong)local_18 * 8) = 0xffffffffffffffff;
    }
  }
  return;
}

Assistant:

void SVInt::initSlowCase(uint64_t value) {
    uint32_t words = getNumWords();
    pVal = new uint64_t[words](); // allocation is zero cleared
    pVal[0] = value;

    // sign extend if necessary
    if (signFlag && int64_t(value) < 0) {
        for (uint32_t i = 1; i < words; i++)
            pVal[i] = (uint64_t)(-1);
    }
}